

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Expected<llvm::DWARFDebugNames::AttributeEncoding> __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncoding(NameIndex *this,uint64_t *Offset)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char *Msg;
  uint64_t *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  Expected<llvm::DWARFDebugNames::AttributeEncoding> EVar4;
  error_code EC;
  AttributeEncoding local_38;
  Error local_30;
  
  if (*in_RDX < Offset[0x12]) {
    uVar1 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),in_RDX,(Error *)0x0);
    uVar2 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),in_RDX,(Error *)0x0);
    local_38.Index = (Index)uVar1;
    local_38.Form = (Form)uVar2;
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::
    Expected<llvm::DWARFDebugNames::AttributeEncoding>
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)this,&local_38,(type *)0x0);
    uVar3 = extraout_RDX;
  }
  else {
    Msg = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x54;
    EC._0_8_ = &local_30;
    createStringError(EC,Msg);
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::Expected
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)this,&local_30);
    uVar3 = extraout_RDX_00;
    if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
      uVar3 = extraout_RDX_01;
    }
  }
  EVar4._8_8_ = uVar3;
  EVar4.field_0 =
       (anon_union_8_2_427f0595_for_Expected<llvm::DWARFDebugNames::AttributeEncoding>_2)this;
  return EVar4;
}

Assistant:

Expected<DWARFDebugNames::AttributeEncoding>
DWARFDebugNames::NameIndex::extractAttributeEncoding(uint64_t *Offset) {
  if (*Offset >= EntriesBase) {
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated abbreviation table.");
  }

  uint32_t Index = Section.AccelSection.getULEB128(Offset);
  uint32_t Form = Section.AccelSection.getULEB128(Offset);
  return AttributeEncoding(dwarf::Index(Index), dwarf::Form(Form));
}